

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

uint8_t * get_wedge_mask_inplace(int wedge_index,int neg,BLOCK_SIZE sb_type)

{
  long lVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  long lVar4;
  
  uVar2 = CONCAT71(in_register_00000011,sb_type) & 0xffffffff;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000011,sb_type) << 5);
  lVar4 = (long)wedge_index * 0xc;
  lVar1 = *(long *)((long)&av1_wedge_params_lookup[0].codebook + uVar3);
  return wedge_mask_obl
         [(uint)*(byte *)(*(long *)((long)&av1_wedge_params_lookup[0].signflip + uVar3) +
                         (long)wedge_index) ^ neg][*(byte *)(lVar1 + lVar4)] +
         (long)-((int)((uint)block_size_wide[uVar2] * *(int *)(lVar1 + 4 + lVar4)) >> 3) +
         (long)(int)(((uint)block_size_high[uVar2] * *(int *)(lVar1 + 8 + lVar4) & 0x1ffffff8) * -8
                    + 0x800) + 0x20;
}

Assistant:

static const uint8_t *get_wedge_mask_inplace(int wedge_index, int neg,
                                             BLOCK_SIZE sb_type) {
  const uint8_t *master;
  const int bh = block_size_high[sb_type];
  const int bw = block_size_wide[sb_type];
  const wedge_code_type *a =
      av1_wedge_params_lookup[sb_type].codebook + wedge_index;
  int woff, hoff;
  const uint8_t wsignflip =
      av1_wedge_params_lookup[sb_type].signflip[wedge_index];

  assert(wedge_index >= 0 && wedge_index < get_wedge_types_lookup(sb_type));
  woff = (a->x_offset * bw) >> 3;
  hoff = (a->y_offset * bh) >> 3;
  master = wedge_mask_obl[neg ^ wsignflip][a->direction] +
           MASK_MASTER_STRIDE * (MASK_MASTER_SIZE / 2 - hoff) +
           MASK_MASTER_SIZE / 2 - woff;
  return master;
}